

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

string * dg::vr::strip(string *__return_storage_ptr__,string *str,size_t skipSpaces)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = skipSpaces != 0;
  if (bVar6) {
    paVar1 = &str->field_2;
    uVar5 = 1;
    do {
      lVar4 = std::__cxx11::string::find((char)str,0x20);
      if (lVar4 == -1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (str->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = str->_M_string_length;
        (str->_M_dataplus)._M_p = (pointer)paVar1;
        str->_M_string_length = 0;
        (str->field_2)._M_local_buf[0] = '\0';
      }
      if (lVar4 == -1) break;
      bVar6 = uVar5 < skipSpaces;
      bVar7 = uVar5 != skipSpaces;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  if (!bVar6) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string strip(std::string str, size_t skipSpaces) {
    assert(!str.empty() && !std::isspace(str[0]));

    size_t lastIndex = 0;
    for (size_t i = 0; i < skipSpaces; ++i) {
        size_t nextIndex = str.find(' ', lastIndex + 1);
        if (nextIndex == std::string::npos)
            return str;
        lastIndex = nextIndex;
    }
    return str.substr(0, lastIndex);
}